

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O1

base_learner * warm_cb_setup(options_i *options,vw *all)

{
  float *location;
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  parser *ppVar3;
  bool bVar4;
  bool bVar5;
  vw *all_00;
  undefined8 uVar6;
  int iVar7;
  warm_cb *pwVar8;
  _func_int ***ppp_Var9;
  option_group_definition *poVar10;
  typed_option<float> *ptVar11;
  typed_option<unsigned_int> *ptVar12;
  typed_option<int> *ptVar13;
  base_learner *l;
  multi_learner *base;
  learner<warm_cb,_example> *plVar14;
  vw_exception *this;
  long lVar15;
  options_i *options_00;
  char cVar16;
  undefined **ppuVar17;
  label_parser *plVar18;
  byte bVar19;
  float fVar20;
  float fVar21;
  bool use_cs;
  uint32_t num_actions;
  size_type __dnew_19;
  option_group_definition new_options;
  size_type __dnew_3;
  size_type __dnew;
  size_type __dnew_1;
  size_type __dnew_2;
  size_type __dnew_4;
  size_type __dnew_8;
  size_type __dnew_14;
  size_type __dnew_12;
  size_type __dnew_10;
  size_type __dnew_5;
  size_type __dnew_18;
  size_type __dnew_7;
  size_type __dnew_17;
  size_type __dnew_16;
  size_type __dnew_6;
  bool local_ef9;
  warm_cb *local_ef8;
  uint local_eec;
  options_i *local_ee8;
  float *local_ee0;
  _func_int ***local_ed8;
  _func_int **local_ed0;
  _func_int **local_ec8 [2];
  float *local_eb8;
  uint32_t *local_eb0;
  float *local_ea8;
  vw *local_ea0;
  long local_e98;
  _func_int ***local_e90;
  _func_int **local_e88;
  _func_int **local_e80 [2];
  _func_int ***local_e70;
  _func_int **local_e68;
  _func_int **local_e60 [2];
  _func_int ***local_e50;
  _func_int **local_e48;
  _func_int **local_e40 [2];
  string local_e30;
  _func_int ***local_e10;
  _func_int **local_e08;
  _func_int **local_e00 [2];
  string local_df0;
  _func_int ***local_dd0;
  _func_int **local_dc8;
  _func_int **local_dc0 [2];
  string local_db0;
  _func_int ***local_d90;
  _func_int **local_d88;
  _func_int **local_d80 [2];
  string local_d70;
  _func_int ***local_d50;
  _func_int **local_d48;
  _func_int **local_d40 [2];
  _func_int ***local_d30;
  _func_int **local_d28;
  _func_int **local_d20 [2];
  _func_int ***local_d10;
  _func_int **local_d08;
  _func_int **local_d00 [2];
  _func_int ***local_cf0;
  _func_int **local_ce8;
  _func_int **local_ce0 [2];
  _func_int ***local_cd0;
  _func_int **local_cc8;
  _func_int **local_cc0 [2];
  _func_int ***local_cb0;
  _func_int **local_ca8;
  _func_int **local_ca0 [2];
  _func_int ***local_c90;
  _func_int **local_c88;
  _func_int **local_c80 [2];
  string local_c70;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  option_group_definition local_b70;
  long *local_b38;
  long local_b30;
  long local_b28 [2];
  _func_int ***local_b18;
  _func_int **local_b10;
  _func_int **local_b08 [2];
  undefined1 local_af8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_ae0 [7];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a60;
  undefined1 local_a58 [20];
  undefined4 uStack_a44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a40;
  string local_a28 [64];
  bool local_9e8;
  ios_base local_9d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9c0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  undefined1 local_850 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7b8;
  typed_option<float> local_7b0;
  typed_option<unsigned_int> local_710;
  undefined1 local_670 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d8;
  typed_option<unsigned_int> local_5d0;
  typed_option<float> local_530;
  typed_option<int> local_490;
  undefined1 local_3f0 [112];
  bool local_380;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  undefined1 local_2b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  typed_option<unsigned_int> local_210;
  typed_option<int> local_170;
  typed_option<unsigned_int> local_d0;
  
  bVar19 = 0;
  local_eec = 0;
  local_ee8 = options;
  pwVar8 = calloc_or_throw<warm_cb>(1);
  memset(pwVar8,0,0x180);
  local_a58._0_8_ = (_func_int **)0x34;
  local_ef8 = pwVar8;
  local_ed8 = local_ec8;
  local_ed8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_ed8,(ulong)local_a58);
  local_ec8[0] = (_func_int **)local_a58._0_8_;
  local_ed8[4] = (_func_int **)0x65746e6f4320676e;
  local_ed8[5] = (_func_int **)0x6142206c61757478;
  local_ed8[2] = (_func_int **)0x726157206f746e69;
  local_ed8[3] = (_func_int **)0x6974726174732d6d;
  *local_ed8 = (_func_int **)0x6c754d20656b614d;
  local_ed8[1] = (_func_int **)0x207373616c636974;
  *(undefined4 *)(local_ed8 + 6) = 0x7469646e;
  local_ed0 = (_func_int **)local_a58._0_8_;
  *(char *)((long)local_ed8 + local_a58._0_8_) = '\0';
  local_b70.m_name._M_dataplus._M_p = (pointer)&local_b70.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b70,local_ed8,(char *)(local_a58._0_8_ + (long)local_ed8));
  local_b70.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b70.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b70.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_ed8 != local_ec8) {
    operator_delete(local_ed8);
  }
  local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
  local_b90.field_2._M_allocated_capacity._0_4_ = 0x6d726177;
  local_b90.field_2._M_allocated_capacity._4_3_ = 0x62635f;
  local_b90._M_string_length = 7;
  local_b90.field_2._M_local_buf[7] = '\0';
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_a58,&local_b90,&local_eec);
  local_9e8 = true;
  local_c90 = local_c80;
  local_850._0_8_ = (_func_int **)0x42;
  ppp_Var9 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_c90,(ulong)local_850);
  uVar6 = local_850._0_8_;
  local_c80[0] = (_func_int **)local_850._0_8_;
  local_c90 = ppp_Var9;
  memcpy(ppp_Var9,"Convert multiclass on <k> classes into a contextual bandit problem",0x42);
  local_c88 = (_func_int **)uVar6;
  *(undefined1 *)((long)ppp_Var9 + uVar6) = 0;
  std::__cxx11::string::_M_assign(local_a28);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                      (&local_b70,(typed_option<unsigned_int> *)local_a58);
  local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
  local_bb0.field_2._M_allocated_capacity = 0x5f62635f6d726177;
  local_bb0.field_2._8_2_ = 0x7363;
  local_bb0._M_string_length = 10;
  local_bb0.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_850,&local_bb0,&local_ef9);
  local_cb0 = local_ca0;
  local_7b0.super_base_option._vptr_base_option = (_func_int **)0x44;
  local_ea0 = all;
  ppp_Var9 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_cb0,(ulong)&local_7b0);
  pp_Var1 = local_7b0.super_base_option._vptr_base_option;
  local_ca0[0] = local_7b0.super_base_option._vptr_base_option;
  local_cb0 = ppp_Var9;
  memcpy(ppp_Var9,"consume cost-sensitive classification examples instead of multiclass",0x44);
  local_ca8 = pp_Var1;
  *(undefined1 *)((long)ppp_Var9 + (long)pp_Var1) = 0;
  std::__cxx11::string::_M_assign((string *)(local_850 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar10,(typed_option<bool> *)local_850);
  local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
  local_bd0.field_2._M_allocated_capacity._0_4_ = 0x73736f6c;
  local_bd0.field_2._M_allocated_capacity._4_2_ = 0x30;
  local_bd0._M_string_length = 5;
  local_ee0 = &pwVar8->loss0;
  VW::config::typed_option<float>::typed_option(&local_7b0,&local_bd0,local_ee0);
  ptVar11 = VW::config::typed_option<float>::default_value(&local_7b0,0.0);
  local_cd0 = local_cc0;
  local_af8._0_8_ = (_func_int **)0x16;
  local_cd0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_cd0,(ulong)local_af8);
  local_cc0[0] = (_func_int **)local_af8._0_8_;
  *local_cd0 = (_func_int **)0x726f662073736f6c;
  local_cd0[1] = (_func_int **)0x74636572726f6320;
  builtin_strncpy((char *)((long)local_cd0 + 0xe),"ct label",8);
  local_cc8 = (_func_int **)local_af8._0_8_;
  *(char *)((long)local_cd0 + local_af8._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar11->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                      (poVar10,ptVar11);
  local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
  local_bf0.field_2._M_allocated_capacity._0_4_ = 0x73736f6c;
  local_bf0.field_2._M_allocated_capacity._4_2_ = 0x31;
  local_bf0._M_string_length = 5;
  location = &local_ef8->loss1;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_af8,&local_bf0,location);
  ptVar11 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_af8,1.0);
  local_cf0 = local_ce0;
  local_710.super_base_option._vptr_base_option = (_func_int **)0x18;
  local_cf0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_cf0,(ulong)&local_710);
  local_ce0[0] = local_710.super_base_option._vptr_base_option;
  *local_cf0 = (_func_int **)0x726f662073736f6c;
  local_cf0[1] = (_func_int **)0x6572726f636e6920;
  local_cf0[2] = (_func_int **)0x6c6562616c207463;
  local_ce8 = local_710.super_base_option._vptr_base_option;
  *(char *)((long)local_cf0 + (long)local_710.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar11->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                      (poVar10,ptVar11);
  pwVar8 = local_ef8;
  local_c10._M_dataplus._M_p = (pointer)&local_c10.field_2;
  local_c10.field_2._M_allocated_capacity = 0x6174735f6d726177;
  local_c10.field_2._8_2_ = 0x7472;
  local_c10._M_string_length = 10;
  local_c10.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<unsigned_int>::typed_option(&local_710,&local_c10,&local_ef8->ws_period);
  ptVar12 = VW::config::typed_option<unsigned_int>::default_value(&local_710,0);
  local_d10 = local_d00;
  local_3f0._0_8_ = (_func_int **)0x30;
  local_d10 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_d10,(ulong)local_3f0);
  local_d00[0] = (_func_int **)local_3f0._0_8_;
  local_d10[4] = (_func_int **)0x617473206d726177;
  local_d10[5] = (_func_int **)0x6573616870207472;
  local_d10[2] = (_func_int **)0x706d61786520676e;
  local_d10[3] = (_func_int **)0x20726f662073656c;
  *local_d10 = (_func_int **)0x6f207265626d756e;
  local_d10[1] = (_func_int **)0x696e696172742066;
  local_d08 = (_func_int **)local_3f0._0_8_;
  *(char *)((long)local_d10 + local_3f0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                      (poVar10,ptVar12);
  local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
  local_c30.field_2._M_allocated_capacity._0_4_ = 0x69737065;
  local_c30.field_2._M_allocated_capacity._4_3_ = 0x6e6f6c;
  local_c30._M_string_length = 7;
  local_c30.field_2._M_local_buf[7] = '\0';
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_3f0,&local_c30,&pwVar8->epsilon);
  local_380 = true;
  local_d30 = local_d20;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x1a;
  local_d30 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_d30,(ulong)&local_d0);
  local_d20[0] = local_d0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_d30 + 10),"eedy exp",8);
  builtin_strncpy((char *)((long)local_d30 + 0x12),"loration",8);
  *local_d30 = (_func_int **)0x2d6e6f6c69737065;
  local_d30[1] = (_func_int **)0x6520796465657267;
  local_d28 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_d30 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                      (poVar10,(typed_option<float> *)local_3f0);
  local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
  local_c50.field_2._M_allocated_capacity._0_7_ = 0x63617265746e69;
  local_c50.field_2._7_4_ = 0x6e6f6974;
  local_c50._M_string_length = 0xb;
  local_c50.field_2._M_local_buf[0xb] = '\0';
  VW::config::typed_option<unsigned_int>::typed_option(&local_d0,&local_c50,&pwVar8->inter_period);
  ptVar12 = VW::config::typed_option<unsigned_int>::default_value(&local_d0,0xffffffff);
  local_d50 = local_d40;
  local_2b0._0_8_ = (_func_int **)0x47;
  local_eb8 = &pwVar8->epsilon;
  local_ea8 = location;
  ppp_Var9 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_d50,(ulong)local_2b0);
  uVar6 = local_2b0._0_8_;
  local_d40[0] = (_func_int **)local_2b0._0_8_;
  local_d50 = ppp_Var9;
  memcpy(ppp_Var9,"number of examples for the interactive contextual bandit learning phase",0x47);
  local_d48 = (_func_int **)uVar6;
  *(undefined1 *)((long)ppp_Var9 + uVar6) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                      (poVar10,ptVar12);
  local_d70._M_dataplus._M_p = (pointer)&local_d70.field_2;
  local_670._0_8_ = (_func_int **)0x11;
  local_d70._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d70,(ulong)local_670);
  local_d70.field_2._M_allocated_capacity = local_670._0_8_;
  builtin_strncpy(local_d70._M_dataplus._M_p,"warm_start_update",0x11);
  local_d70._M_string_length = local_670._0_8_;
  local_d70._M_dataplus._M_p[local_670._0_8_] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_d70,&pwVar8->upd_ws);
  local_d90 = local_d80;
  local_670._0_8_ = (_func_int **)0x1f;
  local_d90 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_d90,(ulong)local_670);
  local_d80[0] = (_func_int **)local_670._0_8_;
  builtin_strncpy((char *)((long)local_d90 + 0xf),"rm start",8);
  builtin_strncpy((char *)((long)local_d90 + 0x17)," updates",8);
  *local_d90 = (_func_int **)0x6f74616369646e69;
  local_d90[1] = (_func_int **)0x72617720666f2072;
  local_d88 = (_func_int **)local_670._0_8_;
  *(char *)((long)local_d90 + local_670._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar10,(typed_option<bool> *)local_2b0);
  local_db0._M_dataplus._M_p = (pointer)&local_db0.field_2;
  local_490.super_base_option._vptr_base_option = (_func_int **)0x12;
  local_db0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_db0,(ulong)&local_490);
  local_db0.field_2._M_allocated_capacity = (size_type)local_490.super_base_option._vptr_base_option
  ;
  builtin_strncpy(local_db0._M_dataplus._M_p,"interaction_update",0x12);
  local_db0._M_string_length = (size_type)local_490.super_base_option._vptr_base_option;
  local_db0._M_dataplus._M_p[(long)local_490.super_base_option._vptr_base_option] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_670,&local_db0,&pwVar8->upd_inter);
  local_dd0 = local_dc0;
  local_490.super_base_option._vptr_base_option = (_func_int **)0x20;
  local_dd0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_dd0,(ulong)&local_490);
  local_dc0[0] = local_490.super_base_option._vptr_base_option;
  local_dd0[2] = (_func_int **)0x6e6f697463617265;
  local_dd0[3] = (_func_int **)0x7365746164707520;
  *local_dd0 = (_func_int **)0x6f74616369646e69;
  local_dd0[1] = (_func_int **)0x746e6920666f2072;
  local_dc8 = local_490.super_base_option._vptr_base_option;
  *(char *)((long)local_dd0 + (long)local_490.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar10,(typed_option<bool> *)local_670);
  local_df0._M_dataplus._M_p = (pointer)&local_df0.field_2;
  local_530.super_base_option._vptr_base_option = (_func_int **)0x17;
  local_df0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_df0,(ulong)&local_530);
  local_df0.field_2._M_allocated_capacity = (size_type)local_530.super_base_option._vptr_base_option
  ;
  builtin_strncpy(local_df0._M_dataplus._M_p,"corrupt_type_warm_start",0x17);
  local_df0._M_string_length = (size_type)local_530.super_base_option._vptr_base_option;
  local_df0._M_dataplus._M_p[(long)local_530.super_base_option._vptr_base_option] = '\0';
  VW::config::typed_option<int>::typed_option(&local_490,&local_df0,&pwVar8->cor_type_ws);
  ptVar13 = VW::config::typed_option<int>::default_value(&local_490,1);
  local_e10 = local_e00;
  local_530.super_base_option._vptr_base_option = (_func_int **)0x7b;
  ppp_Var9 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_e10,(ulong)&local_530);
  pp_Var1 = local_530.super_base_option._vptr_base_option;
  local_e00[0] = local_530.super_base_option._vptr_base_option;
  local_e10 = ppp_Var9;
  memcpy(ppp_Var9,
         "type of label corruption in the warm start phase (1: uniformly at random, 2: circular, 3: replacing with overwriting label)"
         ,0x7b);
  local_e08 = pp_Var1;
  *(undefined1 *)((long)ppp_Var9 + (long)pp_Var1) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar13->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>
                      (poVar10,ptVar13);
  local_e30._M_dataplus._M_p = (pointer)&local_e30.field_2;
  local_5d0.super_base_option._vptr_base_option = (_func_int **)0x17;
  local_e30._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e30,(ulong)&local_5d0);
  local_e30.field_2._M_allocated_capacity = (size_type)local_5d0.super_base_option._vptr_base_option
  ;
  builtin_strncpy(local_e30._M_dataplus._M_p,"corrupt_prob_warm_start",0x17);
  local_e30._M_string_length = (size_type)local_5d0.super_base_option._vptr_base_option;
  local_e30._M_dataplus._M_p[(long)local_5d0.super_base_option._vptr_base_option] = '\0';
  VW::config::typed_option<float>::typed_option(&local_530,&local_e30,&pwVar8->cor_prob_ws);
  ptVar11 = VW::config::typed_option<float>::default_value(&local_530,0.0);
  local_e50 = local_e40;
  local_5d0.super_base_option._vptr_base_option = (_func_int **)0x37;
  local_e50 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_e50,(ulong)&local_5d0);
  local_e40[0] = local_5d0.super_base_option._vptr_base_option;
  local_e50[4] = (_func_int **)0x7720656874206e69;
  local_e50[5] = (_func_int **)0x72617473206d7261;
  local_e50[2] = (_func_int **)0x726f63206c656261;
  local_e50[3] = (_func_int **)0x206e6f6974707572;
  *local_e50 = (_func_int **)0x6c696261626f7270;
  local_e50[1] = (_func_int **)0x6c20666f20797469;
  builtin_strncpy((char *)((long)local_e50 + 0x2f),"rt phase",8);
  local_e48 = local_5d0.super_base_option._vptr_base_option;
  *(char *)((long)local_e50 + (long)local_5d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar11->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                      (poVar10,ptVar11);
  local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
  local_c70.field_2._M_allocated_capacity._0_6_ = 0x6563696f6863;
  local_c70.field_2._M_allocated_capacity._6_2_ = 0x5f73;
  local_c70.field_2._8_6_ = 0x6164626d616c;
  local_c70._M_string_length = 0xe;
  local_c70.field_2._M_local_buf[0xe] = '\0';
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_5d0,&local_c70,&pwVar8->choices_lambda);
  ptVar12 = VW::config::typed_option<unsigned_int>::default_value(&local_5d0,1);
  local_e70 = local_e60;
  local_170.super_base_option._vptr_base_option = (_func_int **)0x70;
  ppp_Var9 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_e70,(ulong)&local_170);
  pp_Var1 = local_170.super_base_option._vptr_base_option;
  local_e60[0] = local_170.super_base_option._vptr_base_option;
  local_eb0 = &pwVar8->choices_lambda;
  local_e70 = ppp_Var9;
  memcpy(ppp_Var9,
         "the number of candidate lambdas to aggregate (lambda is the importance weight parameter between the two sources)"
         ,0x70);
  local_e68 = pp_Var1;
  *(undefined1 *)((long)ppp_Var9 + (long)pp_Var1) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                      (poVar10,ptVar12);
  local_890.field_2._M_allocated_capacity._0_5_ = 0x64626d616c;
  local_890.field_2._M_allocated_capacity._5_3_ = 0x735f61;
  local_890.field_2._8_5_ = 0x656d656863;
  local_890._M_string_length = 0xd;
  local_890.field_2._M_local_buf[0xd] = '\0';
  local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
  VW::config::typed_option<int>::typed_option(&local_170,&local_890,&local_ef8->lambda_scheme);
  ptVar13 = VW::config::typed_option<int>::default_value(&local_170,1);
  local_e90 = local_e80;
  local_210.super_base_option._vptr_base_option = (_func_int **)0x12a;
  ppp_Var9 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_e90,(ulong)&local_210);
  pp_Var1 = local_210.super_base_option._vptr_base_option;
  local_e80[0] = local_210.super_base_option._vptr_base_option;
  local_e90 = ppp_Var9;
  memcpy(ppp_Var9,
         "The scheme for generating candidate lambda set (1: center lambda=0.5, 2: center lambda=0.5, min lambda=0, max lambda=1, 3: center lambda=epsilon/(1+epsilon), 4: center lambda=epsilon/(1+epsilon), min lambda=0, max lambda=1); the rest of candidate lambda values are generated using a doubling scheme"
         ,0x12a);
  local_e88 = pp_Var1;
  *(undefined1 *)((long)ppp_Var9 + (long)pp_Var1) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar13->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>
                      (poVar10,ptVar13);
  local_8b0.field_2._M_allocated_capacity._0_7_ = 0x6972777265766f;
  local_8b0.field_2._M_local_buf[7] = 't';
  local_8b0.field_2._8_7_ = 0x6c6562616c5f65;
  local_8b0._M_string_length = 0xf;
  local_8b0.field_2._M_local_buf[0xf] = '\0';
  local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_210,&local_8b0,&local_ef8->overwrite_label);
  ptVar12 = VW::config::typed_option<unsigned_int>::default_value(&local_210,1);
  local_350._0_8_ = (_func_int **)0x32;
  local_b18 = local_b08;
  local_b18 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_b18,(ulong)local_350);
  local_b08[0] = (_func_int **)local_350._0_8_;
  local_b18[4] = (_func_int **)0x766f2820736e6f69;
  local_b18[5] = (_func_int **)0x6e69746972777265;
  local_b18[2] = (_func_int **)0x3320657079742079;
  local_b18[3] = (_func_int **)0x74707572726f6320;
  *local_b18 = (_func_int **)0x6562616c20656874;
  local_b18[1] = (_func_int **)0x622064657375206c;
  *(undefined2 *)(local_b18 + 6) = 0x2967;
  local_b10 = (_func_int **)local_350._0_8_;
  *(char *)((long)local_b18 + local_350._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                      (poVar10,ptVar12);
  local_8d0.field_2._M_allocated_capacity = 0x646e61625f6d6973;
  local_8d0.field_2._8_2_ = 0x7469;
  local_8d0._M_string_length = 10;
  local_8d0.field_2._M_local_buf[10] = '\0';
  local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_8d0,&local_ef8->sim_bandit);
  local_e98 = 0x39;
  local_b38 = local_b28;
  local_b38 = (long *)std::__cxx11::string::_M_create((ulong *)&local_b38,(ulong)&local_e98);
  local_b28[0] = local_e98;
  builtin_strncpy((char *)((long)local_b38 + 0x29),"m start ",8);
  builtin_strncpy((char *)((long)local_b38 + 0x31),"examples",8);
  local_b38[4] = 0x6177206e6f207365;
  local_b38[5] = 0x7472617473206d72;
  local_b38[2] = 0x646e6162206c6175;
  local_b38[3] = 0x7461647075207469;
  *local_b38 = 0x6574616c756d6973;
  local_b38[1] = 0x747865746e6f6320;
  local_b30 = local_e98;
  *(char *)((long)local_b38 + local_e98) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar10,(typed_option<bool> *)local_350);
  if (local_b38 != local_b28) {
    operator_delete(local_b38);
  }
  local_350._0_8_ = &PTR__typed_option_002d4dd0;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
    operator_delete(local_8d0._M_dataplus._M_p);
  }
  if (local_b18 != local_b08) {
    operator_delete(local_b18);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6d60;
  if (local_210.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
    operator_delete(local_8b0._M_dataplus._M_p);
  }
  if (local_e90 != local_e80) {
    operator_delete(local_e90);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6da0;
  if (local_170.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_dataplus._M_p != &local_890.field_2) {
    operator_delete(local_890._M_dataplus._M_p);
  }
  if (local_e70 != local_e60) {
    operator_delete(local_e70);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6d60;
  if (local_5d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
    operator_delete(local_c70._M_dataplus._M_p);
  }
  if (local_e50 != local_e40) {
    operator_delete(local_e50);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6d40;
  if (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
    operator_delete(local_e30._M_dataplus._M_p);
  }
  if (local_e10 != local_e00) {
    operator_delete(local_e10);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6da0;
  if (local_490.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  all_00 = local_ea0;
  if (local_490.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df0._M_dataplus._M_p != &local_df0.field_2) {
    operator_delete(local_df0._M_dataplus._M_p);
  }
  if (local_dd0 != local_dc0) {
    operator_delete(local_dd0);
  }
  local_670._0_8_ = &PTR__typed_option_002d4dd0;
  if (local_5d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d8._M_pi);
  }
  if (local_5e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_db0._M_dataplus._M_p != &local_db0.field_2) {
    operator_delete(local_db0._M_dataplus._M_p);
  }
  if (local_d90 != local_d80) {
    operator_delete(local_d90);
  }
  local_2b0._0_8_ = &PTR__typed_option_002d4dd0;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
    operator_delete(local_d70._M_dataplus._M_p);
  }
  if (local_d50 != local_d40) {
    operator_delete(local_d50);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6d60;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
    operator_delete(local_c50._M_dataplus._M_p);
  }
  if (local_d30 != local_d20) {
    operator_delete(local_d30);
  }
  local_3f0._0_8_ = &PTR__typed_option_002d6d40;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
    operator_delete(local_c30._M_dataplus._M_p);
  }
  if (local_d10 != local_d00) {
    operator_delete(local_d10);
  }
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6d60;
  if (local_710.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c10._M_dataplus._M_p != &local_c10.field_2) {
    operator_delete(local_c10._M_dataplus._M_p);
  }
  if (local_cf0 != local_ce0) {
    operator_delete(local_cf0);
  }
  local_af8._0_8_ = &PTR__typed_option_002d6d40;
  if (local_a60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a60._M_pi);
  }
  if (local_a70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a70._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_af8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
    operator_delete(local_bf0._M_dataplus._M_p);
  }
  if (local_cd0 != local_cc0) {
    operator_delete(local_cd0);
  }
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6d40;
  if (local_7b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
    operator_delete(local_bd0._M_dataplus._M_p);
  }
  if (local_cb0 != local_ca0) {
    operator_delete(local_cb0);
  }
  local_850._0_8_ = &PTR__typed_option_002d4dd0;
  if (local_7b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7b8._M_pi);
  }
  if (local_7c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_850);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
    operator_delete(local_bb0._M_dataplus._M_p);
  }
  if (local_c90 != local_c80) {
    operator_delete(local_c90);
  }
  local_a58._0_8_ = &PTR__typed_option_002d6d60;
  if (local_9c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9c0._M_pi);
  }
  if (local_9d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9d0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_a58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
    operator_delete(local_b90._M_dataplus._M_p);
  }
  options_00 = local_ee8;
  (**local_ee8->_vptr_options_i)(local_ee8,&local_b70);
  bVar5 = local_ef9;
  if (local_ef9 == true) {
    local_850._0_8_ = local_850 + 0x10;
    local_a58._0_8_ = (_func_int **)0x17;
    local_850._0_8_ = std::__cxx11::string::_M_create((ulong *)local_850,(ulong)local_a58);
    local_850._16_8_ = local_a58._0_8_;
    *(undefined8 *)local_850._0_8_ = 0x5f74707572726f63;
    *(undefined8 *)(local_850._0_8_ + 8) = 0x7261775f65707974;
    builtin_strncpy((char *)(local_850._0_8_ + 0xf),"rm_start",8);
    local_850._8_8_ = local_a58._0_8_;
    *(char *)(local_850._0_8_ + local_a58._0_8_) = '\0';
    iVar7 = (*options_00->_vptr_options_i[1])(options_00);
    if ((char)iVar7 == '\0') {
      local_7b0.super_base_option._vptr_base_option =
           (_func_int **)&local_7b0.super_base_option.m_name._M_string_length;
      local_a58._0_8_ = (_func_int **)0x17;
      local_7b0.super_base_option._vptr_base_option =
           (_func_int **)std::__cxx11::string::_M_create((ulong *)&local_7b0,(ulong)local_a58);
      local_7b0.super_base_option.m_name._M_string_length = local_a58._0_8_;
      *local_7b0.super_base_option._vptr_base_option = (_func_int *)0x5f74707572726f63;
      local_7b0.super_base_option._vptr_base_option[1] = (_func_int *)0x7261775f626f7270;
      builtin_strncpy((char *)((long)local_7b0.super_base_option._vptr_base_option + 0xf),"rm_start"
                      ,8);
      local_7b0.super_base_option.m_name._M_dataplus._M_p = (pointer)local_a58._0_8_;
      *(char *)((long)local_7b0.super_base_option._vptr_base_option + local_a58._0_8_) = '\0';
      iVar7 = (*local_ee8->_vptr_options_i[1])();
      cVar16 = (char)iVar7;
      bVar4 = true;
      options_00 = local_ee8;
    }
    else {
      cVar16 = '\x01';
      bVar4 = false;
    }
  }
  else {
    bVar4 = false;
    cVar16 = '\0';
  }
  if ((bVar4) &&
     (local_7b0.super_base_option._vptr_base_option !=
      (_func_int **)&local_7b0.super_base_option.m_name._M_string_length)) {
    operator_delete(local_7b0.super_base_option._vptr_base_option);
  }
  if ((bVar5 != false) && ((undefined1 *)local_850._0_8_ != local_850 + 0x10)) {
    operator_delete((void *)local_850._0_8_);
  }
  if (cVar16 == '\0') {
    pp_Var1 = (_func_int **)(local_a58 + 0x10);
    local_a58._16_4_ = 0x6d726177;
    local_a58._8_8_ = (pointer)0x7;
    uStack_a44 = 0x62635f;
    local_a58._0_8_ = pp_Var1;
    iVar7 = (*options_00->_vptr_options_i[1])(options_00,local_a58);
    if ((_func_int **)local_a58._0_8_ != pp_Var1) {
      operator_delete((void *)local_a58._0_8_);
    }
    if ((char)iVar7 == '\0') {
      plVar14 = (learner<warm_cb,_example> *)0x0;
    }
    else {
      local_ef8->app_seed = 0x337ad8c;
      (local_ef8->a_s)._begin = (action_score *)0x0;
      (local_ef8->a_s)._end = (action_score *)0x0;
      (local_ef8->a_s).end_array = (action_score *)0x0;
      (local_ef8->a_s).erase_count = 0;
      local_ef8->all = all_00;
      local_ef8->use_cs = local_ef9;
      init_adf_data(local_ef8,(ulong)local_eec);
      local_a58._16_4_ = 0x6d5f6263;
      uStack_a44 = 0x635f6e69;
      aStack_a40._M_local_buf[0] = 'o';
      aStack_a40._M_allocated_capacity._1_2_ = 0x7473;
      local_a58._8_8_ = (pointer)0xb;
      aStack_a40._M_local_buf[3] = '\0';
      local_a58._0_8_ = pp_Var1;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_af8,
                 vsnprintf,0x3a,"%f",(double)*local_ee0);
      (*options_00->_vptr_options_i[5])(options_00,local_a58,local_af8);
      pp_Var2 = (_func_int **)(local_af8 + 0x10);
      if ((_func_int **)local_af8._0_8_ != pp_Var2) {
        operator_delete((void *)local_af8._0_8_);
      }
      if ((_func_int **)local_a58._0_8_ != pp_Var1) {
        operator_delete((void *)local_a58._0_8_);
      }
      local_a58._16_4_ = 0x6d5f6263;
      uStack_a44 = 0x635f7861;
      aStack_a40._M_local_buf[0] = 'o';
      aStack_a40._M_allocated_capacity._1_2_ = 0x7473;
      local_a58._8_8_ = (pointer)0xb;
      aStack_a40._M_local_buf[3] = '\0';
      local_a58._0_8_ = pp_Var1;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_af8,
                 vsnprintf,0x3a,"%f",(double)*local_ea8);
      (*options_00->_vptr_options_i[5])(options_00,local_a58,local_af8);
      if ((_func_int **)local_af8._0_8_ != pp_Var2) {
        operator_delete((void *)local_af8._0_8_);
      }
      if ((_func_int **)local_a58._0_8_ != pp_Var1) {
        operator_delete((void *)local_a58._0_8_);
      }
      local_a58._16_4_ = 0x65736162;
      uStack_a44 = 0x656e696c;
      local_a58._8_8_ = (pointer)0x8;
      aStack_a40._M_local_buf[0] = '\0';
      local_a58._0_8_ = pp_Var1;
      iVar7 = (*options_00->_vptr_options_i[1])(options_00);
      if ((_func_int **)local_a58._0_8_ != pp_Var1) {
        operator_delete((void *)local_a58._0_8_);
      }
      if ((char)iVar7 != '\0') {
        std::__cxx11::stringstream::stringstream((stringstream *)local_a58);
        fVar20 = ABS(*local_ee0);
        fVar21 = ABS(local_ee0[1]);
        if (fVar21 <= fVar20) {
          fVar21 = fVar20;
        }
        std::ostream::_M_insert<double>((double)(fVar21 / (local_ee0[1] - *local_ee0)));
        local_af8._16_5_ = 0x756d5f726c;
        local_af8._21_3_ = 0x69746c;
        aaStack_ae0[0]._M_allocated_capacity._0_5_ = 0x7265696c70;
        local_af8._8_8_ = (pointer)0xd;
        aaStack_ae0[0]._M_local_buf[5] = '\0';
        local_af8._0_8_ = pp_Var2;
        std::__cxx11::stringbuf::str();
        (*options_00->_vptr_options_i[5])(options_00,local_af8,&local_710);
        if (local_710.super_base_option._vptr_base_option !=
            (_func_int **)&local_710.super_base_option.m_name._M_string_length) {
          operator_delete(local_710.super_base_option._vptr_base_option);
        }
        if ((_func_int **)local_af8._0_8_ != pp_Var2) {
          operator_delete((void *)local_af8._0_8_);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_a58);
        std::ios_base::~ios_base(local_9d8);
      }
      l = setup_base(options_00,all_00);
      base = LEARNER::as_multiline<char,char>(l);
      local_a58._16_4_ = 0x69737065;
      local_a58._8_8_ = (pointer)0x7;
      uStack_a44 = 0x6e6f6c;
      local_a58._0_8_ = pp_Var1;
      iVar7 = (*options_00->_vptr_options_i[1])(options_00);
      if ((_func_int **)local_a58._0_8_ != pp_Var1) {
        operator_delete((void *)local_a58._0_8_);
      }
      if ((char)iVar7 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Warning: no epsilon (greedy parameter) specified; resetting to 0.05",0x43);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
        *local_eb8 = 0.05;
      }
      ppVar3 = all_00->p;
      if (local_ef9 == true) {
        plVar14 = LEARNER::learner<warm_cb,example>::
                  init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                            (local_ef8,base,predict_or_learn_adf<true,true>,
                             predict_or_learn_adf<false,true>,(ulong)*local_eb0,multiclass);
        *(undefined8 *)(plVar14 + 0x58) = *(undefined8 *)(plVar14 + 0x18);
        *(code **)(plVar14 + 0x68) = COST_SENSITIVE::finish_example<warm_cb>;
        ppuVar17 = &COST_SENSITIVE::cs_label;
      }
      else {
        plVar14 = LEARNER::learner<warm_cb,example>::
                  init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                            (local_ef8,base,predict_or_learn_adf<true,false>,
                             predict_or_learn_adf<false,false>,(ulong)*local_eb0,multiclass);
        *(undefined8 *)(plVar14 + 0x58) = *(undefined8 *)(plVar14 + 0x18);
        *(code **)(plVar14 + 0x68) = MULTICLASS::finish_example<warm_cb>;
        ppuVar17 = &MULTICLASS::mc_label;
      }
      plVar18 = &ppVar3->lp;
      for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
        plVar18->default_label = (_func_void_void_ptr *)*ppuVar17;
        ppuVar17 = ppuVar17 + (ulong)bVar19 * -2 + 1;
        plVar18 = (label_parser *)((long)plVar18 + (ulong)bVar19 * -0x10 + 8);
      }
      *(undefined8 *)(plVar14 + 0xb8) = *(undefined8 *)(plVar14 + 0x18);
      *(undefined8 *)(plVar14 + 0xc0) = *(undefined8 *)(plVar14 + 0x20);
      *(code **)(plVar14 + 200) = finish;
      all_00->delete_prediction = (_func_void_void_ptr *)0x0;
      local_ef8 = (warm_cb *)0x0;
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector(&local_b70.m_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b70.m_name._M_dataplus._M_p != &local_b70.m_name.field_2) {
      operator_delete(local_b70.m_name._M_dataplus._M_p);
    }
    if (local_ef8 != (warm_cb *)0x0) {
      destroy_free<warm_cb>(local_ef8);
    }
    return (base_learner *)plVar14;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_a58);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_a58 + 0x10),
             "label corruption on cost-sensitive examples not currently supported",0x43);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/warm_cb.cc"
             ,0x259,&local_870);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

base_learner* warm_cb_setup(options_i& options, vw& all)
{
  uint32_t num_actions=0;
  auto data = scoped_calloc_or_throw<warm_cb>();
  bool use_cs;

  option_group_definition new_options("Make Multiclass into Warm-starting Contextual Bandit");

  new_options
      .add(make_option("warm_cb", num_actions)
               .keep()
               .help("Convert multiclass on <k> classes into a contextual bandit problem"))
      .add(make_option("warm_cb_cs", use_cs).help("consume cost-sensitive classification examples instead of multiclass"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"))
      .add(make_option("warm_start", data->ws_period).default_value(0U).help("number of training examples for warm start phase"))
      .add(make_option("epsilon", data->epsilon).keep().help("epsilon-greedy exploration"))
      .add(make_option("interaction", data->inter_period).default_value(UINT32_MAX).help("number of examples for the interactive contextual bandit learning phase"))
      .add(make_option("warm_start_update", data->upd_ws).help("indicator of warm start updates"))
      .add(make_option("interaction_update", data->upd_inter).help("indicator of interaction updates"))
      .add(make_option("corrupt_type_warm_start", data->cor_type_ws).default_value(UAR).help("type of label corruption in the warm start phase (1: uniformly at random, 2: circular, 3: replacing with overwriting label)"))
      .add(make_option("corrupt_prob_warm_start", data->cor_prob_ws).default_value(0.f).help("probability of label corruption in the warm start phase"))
      .add(make_option("choices_lambda", data->choices_lambda).default_value(1U).help("the number of candidate lambdas to aggregate (lambda is the importance weight parameter between the two sources)"))
      .add(make_option("lambda_scheme", data->lambda_scheme).default_value(ABS_CENTRAL).help("The scheme for generating candidate lambda set (1: center lambda=0.5, 2: center lambda=0.5, min lambda=0, max lambda=1, 3: center lambda=epsilon/(1+epsilon), 4: center lambda=epsilon/(1+epsilon), min lambda=0, max lambda=1); the rest of candidate lambda values are generated using a doubling scheme"))
      .add(make_option("overwrite_label", data->overwrite_label).default_value(1U).help("the label used by type 3 corruptions (overwriting)"))
      .add(make_option("sim_bandit", data->sim_bandit).help("simulate contextual bandit updates on warm start examples"));

  options.add_and_parse(new_options);

  if( use_cs && ( options.was_supplied("corrupt_type_warm_start") || options.was_supplied("corrupt_prob_warm_start") ) )
  {
    THROW("label corruption on cost-sensitive examples not currently supported");
  }


  if(!options.was_supplied("warm_cb"))
  {
    return nullptr;
  }

  data->app_seed = uniform_hash("vw", 2, 0);
  data->a_s = v_init<action_score>();
  data->all = &all;
	data->use_cs = use_cs;

  init_adf_data(*data.get(), num_actions);

  options.insert("cb_min_cost", to_string(data->loss0));
  options.insert("cb_max_cost", to_string(data->loss1));

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  learner<warm_cb,example>* l;

  multi_learner* base = as_multiline(setup_base(options, all));
	// Note: the current version of warm start CB can only support epsilon-greedy exploration
	// We need to wait for the epsilon value to be passed from the base
  // cb_explore learner, if there is one


  if (!options.was_supplied("epsilon"))
  {
    cerr<<"Warning: no epsilon (greedy parameter) specified; resetting to 0.05"<<endl;
    data->epsilon = 0.05f;
  }

  if (use_cs)
    l = &init_cost_sensitive_learner(data, base, predict_or_learn_adf<true, true>, predict_or_learn_adf<false, true>, all.p, data->choices_lambda);
  else
    l = &init_multiclass_learner(data, base, predict_or_learn_adf<true, false>, predict_or_learn_adf<false, false>, all.p, data->choices_lambda);

  l->set_finish(finish);
  all.delete_prediction = nullptr;

  return make_base(*l);
}